

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::ClampSpeed(ChBody *this)

{
  ChQuaternion<double> *this_00;
  ChCoordsys<double> *this_01;
  double dVar1;
  
  if ((this->bflags & 0x100) != 0) {
    this_00 = &(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot;
    this_01 = &(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt;
    dVar1 = ChQuaternion<double>::Length(this_00);
    if ((double)this->max_wvel < dVar1 + dVar1) {
      ChQuaternion<double>::operator*=(this_00,(double)this->max_wvel / (dVar1 + dVar1));
    }
    dVar1 = ChVector<double>::Length(&this_01->pos);
    if ((double)this->max_speed < dVar1) {
      ChVector<double>::operator*=(&this_01->pos,(double)this->max_speed / dVar1);
      return;
    }
  }
  return;
}

Assistant:

bool ChBody::BFlagGet(BodyFlag mask) const {
    return (bflags & mask) != 0;
}